

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableIntTest_InsertRange_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_InsertRange_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pdVar1;
  bool bVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBVar8;
  pair<const_int,_int> pVar9;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBVar10;
  char *in_R9;
  long lVar11;
  set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
  set_input;
  value_type input [4];
  TypeParam ht_source;
  AssertHelper local_168;
  string local_160;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  undefined8 *local_138;
  AssertHelper local_130;
  undefined1 local_128 [8];
  undefined1 local_120 [8];
  _Base_ptr local_118;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_110;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_108;
  size_type local_100;
  undefined1 local_f8 [16];
  pair<const_int,_int> local_e8;
  pair<const_int,_int> local_e0 [2];
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_d0;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_b8;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_b0;
  
  local_160._M_dataplus._M_p = (pointer)0x0;
  local_160._M_string_length = local_160._M_string_length & 0xffffffff00000000;
  local_f8._0_4_ = 0;
  local_f8._4_4_ = 0;
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffff00000000;
  local_128 = (undefined1  [8])((ulong)local_128 & 0xffffffff00000000);
  local_120 = (undefined1  [8])0x0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_b0,0,(hasher *)&local_160,(key_equal *)local_f8,(allocator_type *)local_128);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(10);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_128,&local_b0,(value_type *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(100);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_128,&local_b0,(value_type *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(1000);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_128,&local_b0,(value_type *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(10000);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_128,&local_b0,(value_type *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(100000);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_128,&local_b0,(value_type *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(1000000);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_128,&local_b0,(value_type *)&local_160);
  local_118 = (_Base_ptr)(local_b0.ht_.rep.table + local_b0.ht_.rep.num_buckets);
  local_120 = (undefined1  [8])local_b0.ht_.rep.table;
  local_128 = (undefined1  [8])&local_b0.ht_;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted
            ((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_128);
  local_f8._0_8_ = *(undefined8 *)local_120;
  local_f8._8_8_ = UniqueObjectHelper<std::pair<int_const,int>>(2);
  local_e8 = UniqueObjectHelper<std::pair<int_const,int>>(4);
  local_e0[0] = UniqueObjectHelper<std::pair<int_const,int>>(8);
  local_110 = (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_120;
  local_120 = (undefined1  [8])((ulong)local_120 & 0xffffffff00000000);
  local_118 = (_Base_ptr)0x0;
  local_100 = 0;
  local_108 = local_110;
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(0x10f447);
  std::
  _Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
              *)local_128,(pair<const_int,_int> *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(0x1b207);
  std::
  _Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
              *)local_128,(pair<const_int,_int> *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  std::
  _Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
              *)local_128,(pair<const_int,_int> *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(0x457);
  std::
  _Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
              *)local_128,(pair<const_int,_int> *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(0x6f);
  std::
  _Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
              *)local_128,(pair<const_int,_int> *)&local_160);
  local_160._M_dataplus._M_p = (pointer)UniqueObjectHelper<std::pair<int_const,int>>(0xb);
  std::
  _Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<std::pair<int_const,int>,std::pair<int_const,int>,std::_Identity<std::pair<int_const,int>>,std::less<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>
              *)local_128,(pair<const_int,_int> *)&local_160);
  local_160.field_2._M_allocated_capacity =
       (size_type)(local_b0.ht_.rep.table + local_b0.ht_.rep.num_buckets);
  local_160._M_string_length = (size_type)local_b0.ht_.rep.table;
  local_160._M_dataplus._M_p = (pointer)&local_b0.ht_;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted
            ((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_160);
  uVar6 = local_160.field_2._M_allocated_capacity;
  sVar5 = local_160._M_string_length;
  _Var4._M_p = local_160._M_dataplus._M_p;
  local_d0.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)local_160._M_dataplus._M_p;
  local_d0.pos = (pointer)local_160._M_string_length;
  local_d0.end = (pointer)local_160.field_2._M_allocated_capacity;
  lVar11 = -3;
  pBStack_b8 = &local_b0;
  do {
    local_d0.pos = local_d0.pos + 1;
    google::
    dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_empty_and_deleted(&local_d0);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0);
  local_160.field_2._8_8_ = &local_b0;
  pdVar1 = &(this->
            super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_.
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  local_160._M_dataplus._M_p = _Var4._M_p;
  local_160._M_string_length = sVar5;
  local_160.field_2._M_allocated_capacity = uVar6;
  google::
  dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::
  insert<google::BaseHashtableInterface<google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
            ((dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)pdVar1);
  local_168.data_._0_4_ = 3;
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->
        super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ).
        super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.
        super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.rep.num_elements -
       (this->
       super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_160,"3u","this->ht_.size()",(uint *)&local_168,
             (unsigned_long *)&local_140);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_140);
    if ((pointer)local_160._M_string_length == (pointer)0x0) {
      pVar9 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar9 = *(pair<const_int,_int> *)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3ac,(char *)pVar9);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (local_140._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  sVar5 = local_160._M_string_length;
  if ((pointer)local_160._M_string_length != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_160._M_string_length !=
        (pair<const_int,_int>)(local_160._M_string_length + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_160._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  local_160._M_string_length =
       (size_type)
       (this->
       super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.table;
  local_160.field_2._M_allocated_capacity =
       local_160._M_string_length +
       (this->
       super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_buckets * 8;
  local_160._M_dataplus._M_p = (pointer)pdVar1;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted
            ((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_160);
  sVar5 = local_160._M_string_length;
  pVar9 = UniqueObjectHelper<std::pair<int_const,int>>(10);
  if ((*(int *)sVar5 != pVar9.first) || (*(int *)(sVar5 + 4) != pVar9.second)) {
    local_160._M_string_length =
         (size_type)
         (this->
         super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ).
         super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.
         super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table;
    local_160.field_2._M_allocated_capacity =
         local_160._M_string_length +
         (this->
         super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ).
         super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.
         super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.num_buckets * 8;
    local_160._M_dataplus._M_p = (pointer)pdVar1;
    google::
    dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_empty_and_deleted
              ((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)&local_160);
    sVar5 = local_160._M_string_length;
    pVar9 = UniqueObjectHelper<std::pair<int_const,int>>(100);
    if ((*(int *)sVar5 != pVar9.first) || (*(int *)(sVar5 + 4) != pVar9.second)) {
      local_160._M_string_length =
           (size_type)
           (this->
           super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.table;
      local_160.field_2._M_allocated_capacity =
           local_160._M_string_length +
           (this->
           super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.num_buckets * 8;
      local_160._M_dataplus._M_p = (pointer)pdVar1;
      google::
      dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::advance_past_empty_and_deleted
                ((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)&local_160);
      sVar5 = local_160._M_string_length;
      pVar9 = UniqueObjectHelper<std::pair<int_const,int>>(1000);
      if ((*(int *)sVar5 != pVar9.first) || (*(int *)(sVar5 + 4) != pVar9.second)) {
        local_160._M_string_length =
             (size_type)
             (this->
             super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.rep.table;
        local_160.field_2._M_allocated_capacity =
             local_160._M_string_length +
             (this->
             super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.rep.num_buckets * 8;
        local_160._M_dataplus._M_p = (pointer)pdVar1;
        google::
        dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        ::advance_past_empty_and_deleted
                  ((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_160);
        sVar5 = local_160._M_string_length;
        pVar9 = UniqueObjectHelper<std::pair<int_const,int>>(10000);
        if ((*(int *)sVar5 != pVar9.first) || (*(int *)(sVar5 + 4) != pVar9.second)) {
          local_160._M_string_length =
               (size_type)
               (this->
               super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.table;
          local_160.field_2._M_allocated_capacity =
               local_160._M_string_length +
               (this->
               super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_buckets * 8;
          local_160._M_dataplus._M_p = (pointer)pdVar1;
          google::
          dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::advance_past_empty_and_deleted
                    ((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)&local_160);
          sVar5 = local_160._M_string_length;
          pVar9 = UniqueObjectHelper<std::pair<int_const,int>>(100000);
          if ((*(int *)sVar5 != pVar9.first) || (*(int *)(sVar5 + 4) != pVar9.second)) {
            local_160._M_string_length =
                 (size_type)
                 (this->
                 super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.table;
            local_160.field_2._M_allocated_capacity =
                 local_160._M_string_length +
                 (this->
                 super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.num_buckets * 8;
            local_160._M_dataplus._M_p = (pointer)pdVar1;
            google::
            dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::advance_past_empty_and_deleted
                      ((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)&local_160);
            sVar5 = local_160._M_string_length;
            pVar9 = UniqueObjectHelper<std::pair<int_const,int>>(1000000);
            bVar2 = pVar9.second == *(int *)(sVar5 + 4);
            bVar3 = *(int *)sVar5 == pVar9.first;
            local_140._M_head_impl._0_1_ = bVar2 && bVar3;
            local_138 = (undefined8 *)0x0;
            if (!bVar2 || !bVar3) {
              testing::Message::Message((Message *)&local_168);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_160,(internal *)&local_140,
                         (AssertionResult *)
                         "*this->ht_.begin() == this->UniqueObject(10) || *this->ht_.begin() == this->UniqueObject(100) || *this->ht_.begin() == this->UniqueObject(1000) || *this->ht_.begin() == this->UniqueObject(10000) || *this->ht_.begin() == this->UniqueObject(100000) || *this->ht_.begin() == this->UniqueObject(1000000)"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_130,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                         ,0x3b2,local_160._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_168);
              testing::internal::AssertHelper::~AssertHelper(&local_130);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p);
              }
              if ((long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_168.data_._4_4_,local_168.data_._0_4_) + 8))();
              }
              puVar7 = local_138;
              if (local_138 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_138 != local_138 + 2) {
                  operator_delete((undefined8 *)*local_138);
                }
                operator_delete(puVar7);
              }
            }
          }
        }
      }
    }
  }
  pBVar8 = local_110;
  lVar11 = -3;
  pBVar10 = local_110;
  do {
    pBVar10 = (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)std::_Rb_tree_increment((_Rb_tree_node_base *)pBVar10);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0);
  google::
  dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert<std::_Rb_tree_const_iterator<std::pair<int_const,int>>>
            ((dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)pdVar1,pBVar8,pBVar10);
  local_168.data_._0_4_ = 6;
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->
        super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ).
        super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.
        super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.rep.num_elements -
       (this->
       super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_160,"6u","this->ht_.size()",(uint *)&local_168,
             (unsigned_long *)&local_140);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_140);
    if ((pointer)local_160._M_string_length == (pointer)0x0) {
      pVar9 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar9 = *(pair<const_int,_int> *)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3bb,(char *)pVar9);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (local_140._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  sVar5 = local_160._M_string_length;
  if ((pointer)local_160._M_string_length != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_160._M_string_length !=
        (pair<const_int,_int>)(local_160._M_string_length + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_160._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  google::
  dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert<std::pair<int_const,int>const*>
            ((dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)pdVar1,(pair<const_int,_int> *)local_f8,local_e0);
  local_168.data_._0_4_ = 8;
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->
        super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ).
        super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.
        super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.rep.num_elements -
       (this->
       super_HashtableIntTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_160,"8u","this->ht_.size()",(uint *)&local_168,
             (unsigned_long *)&local_140);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_140);
    if ((pointer)local_160._M_string_length == (pointer)0x0) {
      pVar9 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar9 = *(pair<const_int,_int> *)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3c1,(char *)pVar9);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (local_140._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  sVar5 = local_160._M_string_length;
  if ((pointer)local_160._M_string_length != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_160._M_string_length !=
        (pair<const_int,_int>)(local_160._M_string_length + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_160._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  std::
  _Rb_tree<std::pair<const_int,_int>,_std::pair<const_int,_int>,_std::_Identity<std::pair<const_int,_int>_>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<const_int,_int>,_std::pair<const_int,_int>,_std::_Identity<std::pair<const_int,_int>_>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_128);
  local_b0._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c16428;
  if (local_b0.ht_.rep.table != (pointer)0x0) {
    free(local_b0.ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, InsertRange) {
  // We just test the ints here, to make the placement-new easier.
  TypeParam ht_source;
  ht_source.insert(this->UniqueObject(10));
  ht_source.insert(this->UniqueObject(100));
  ht_source.insert(this->UniqueObject(1000));
  ht_source.insert(this->UniqueObject(10000));
  ht_source.insert(this->UniqueObject(100000));
  ht_source.insert(this->UniqueObject(1000000));

  const typename TypeParam::value_type input[] = {
      // This is a copy of the first element in ht_source.
      *ht_source.begin(), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};

  set<typename TypeParam::value_type> set_input;
  set_input.insert(this->UniqueObject(1111111));
  set_input.insert(this->UniqueObject(111111));
  set_input.insert(this->UniqueObject(11111));
  set_input.insert(this->UniqueObject(1111));
  set_input.insert(this->UniqueObject(111));
  set_input.insert(this->UniqueObject(11));

  // Insert from ht_source, an iterator of the same type as us.
  typename TypeParam::const_iterator begin = ht_source.begin();
  typename TypeParam::const_iterator end = begin;
  std::advance(end, 3);
  this->ht_.insert(begin, end);  // insert 3 elements from ht_source
  EXPECT_EQ(3u, this->ht_.size());
  EXPECT_TRUE(*this->ht_.begin() == this->UniqueObject(10) ||
              *this->ht_.begin() == this->UniqueObject(100) ||
              *this->ht_.begin() == this->UniqueObject(1000) ||
              *this->ht_.begin() == this->UniqueObject(10000) ||
              *this->ht_.begin() == this->UniqueObject(100000) ||
              *this->ht_.begin() == this->UniqueObject(1000000));

  // And insert from set_input, a separate, non-random-access iterator.
  typename set<typename TypeParam::value_type>::const_iterator set_begin;
  typename set<typename TypeParam::value_type>::const_iterator set_end;
  set_begin = set_input.begin();
  set_end = set_begin;
  std::advance(set_end, 3);
  this->ht_.insert(set_begin, set_end);
  EXPECT_EQ(6u, this->ht_.size());

  // Insert from input as well, a separate, random-access iterator.
  // The first element of input overlaps with an existing element
  // of ht_, so this should only up the size by 2.
  this->ht_.insert(&input[0], &input[3]);
  EXPECT_EQ(8u, this->ht_.size());
}